

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

t_symbol * binbuf_realizedollsym(t_symbol *s,int ac,t_atom *av,int tonew)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  t_symbol *ptVar5;
  t_atom *ptVar6;
  char *pcVar7;
  uint uVar8;
  size_t sVar9;
  t_atom dollarnull;
  char buf2 [1000];
  char buf [1000];
  t_atom local_818;
  char local_808 [999];
  undefined1 local_421;
  ushort local_418 [249];
  undefined1 local_226;
  
  pcVar7 = s->s_name;
  local_818.a_type = A_FLOAT;
  iVar2 = canvas_getdollarzero();
  local_818.a_w.w_float = (t_float)iVar2;
  local_421 = 0;
  local_808[0] = '\0';
  pcVar3 = strchr(pcVar7,0x24);
  if ((pcVar3 == (char *)0x0) || (sVar9 = (long)pcVar3 - (long)pcVar7, 999 < (long)sVar9)) {
    return s;
  }
  strncpy(local_808,pcVar7,sVar9);
  local_808[sVar9] = '\0';
  do {
    pcVar7 = pcVar3 + 1;
    uVar4 = atol(pcVar7);
    local_418[0] = local_418[0] & 0xff00;
    if ((byte)(pcVar3[1] - 0x30U) < 10) {
      uVar8 = 0xffffffff;
      pcVar3 = pcVar7;
      do {
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        uVar8 = uVar8 + 1;
      } while ((byte)(cVar1 - 0x30U) < 10);
      iVar2 = (int)uVar4;
      if (iVar2 < 0 || ac < iVar2) {
        if (tonew == 0) goto LAB_00168952;
        sprintf((char *)local_418,"$%d",uVar4 & 0xffffffff);
      }
      else {
        ptVar6 = av + (iVar2 - 1);
        if (iVar2 == 0) {
          ptVar6 = &local_818;
        }
        if (ptVar6->a_type == A_SYMBOL) {
          ptVar6 = av + (iVar2 - 1);
          if (iVar2 == 0) {
            ptVar6 = &local_818;
          }
          strncpy((char *)local_418,((ptVar6->a_w).w_symbol)->s_name,499);
          local_226 = 0;
        }
        else {
          atom_string(ptVar6,(char *)local_418,499);
        }
      }
    }
    else {
      local_418[0] = 0x24;
LAB_00168952:
      uVar8 = 0;
    }
    if ((uVar8 == 0 && tonew == 0) && ((char)local_418[0] == '\0')) {
      return (t_symbol *)0x0;
    }
    sVar9 = strlen(local_808);
    strncat(local_808,(char *)local_418,999 - sVar9);
    pcVar7 = pcVar7 + uVar8;
    pcVar3 = strchr(pcVar7,0x24);
    if (pcVar3 == (char *)0x0) {
      sVar9 = strlen(local_808);
      strncat(local_808,pcVar7,999 - sVar9);
      ptVar5 = gensym(local_808);
      return ptVar5;
    }
    sVar9 = strlen(local_808);
    uVar4 = 999 - sVar9;
    if ((ulong)((long)pcVar3 - (long)pcVar7) < 999 - sVar9) {
      uVar4 = (long)pcVar3 - (long)pcVar7;
    }
    strncat(local_808,pcVar7,uVar4);
  } while( true );
}

Assistant:

t_symbol *binbuf_realizedollsym(t_symbol *s, int ac, const t_atom *av,
    int tonew)
{
    char buf[MAXPDSTRING];
    char buf2[MAXPDSTRING];
    const char*str=s->s_name;
    char*substr;
    int next=0;
    t_atom dollarnull;
    SETFLOAT(&dollarnull, canvas_getdollarzero());
    buf2[0] = buf2[MAXPDSTRING-1] = 0;

    substr=strchr(str, '$');
    if (!substr || substr-str >= MAXPDSTRING)
        return (s);

    strncpy(buf2, str, (substr-str));
    buf2[substr-str] = 0;
    str=substr+1;

    while((next=binbuf_expanddollsym(str, buf, &dollarnull, ac, av, tonew))>=0)
    {
        /*
        * JMZ: i am not sure what this means, so i might have broken it
        * it seems like that if "tonew" is set and the $arg cannot be expanded
        * (or the dollarsym is in reality a A_DOLLAR)
        * 0 is returned from binbuf_realizedollsym
        * this happens, when expanding in a message-box, but does not happen
        * when the A_DOLLSYM is the name of a subpatch
        */
        if (!tonew && (0==next) && (0==*buf))
        {
            return 0; /* JMZ: this should mimic the original behaviour */
        }

        strncat(buf2, buf, MAXPDSTRING-strlen(buf2)-1);
        str+=next;
        substr=strchr(str, '$');
        if (substr)
        {
            unsigned long n = substr-str;
            if(n>MAXPDSTRING-strlen(buf2)-1) n=MAXPDSTRING-strlen(buf2)-1;
            strncat(buf2, str, n);
            str=substr+1;
        }
        else
        {
            strncat(buf2, str, MAXPDSTRING-strlen(buf2)-1);
            goto done;
        }
    }
done:
    return (gensym(buf2));
}